

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderReturnTests::init(ShaderReturnTests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestNode *pTVar2;
  int extraout_EAX;
  ShaderReturnCase *pSVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ReturnMode RVar10;
  bool bVar11;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string description;
  string name;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  TestNode *local_68;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  char *local_38;
  
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"single_return_vertex",
             "Single return statement in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  RVar10 = RETURNMODE_ALWAYS;
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(this->super_TestCaseGroup).m_context,"single_return_fragment",
             "Single return statement in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  local_68 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
  pTVar2 = local_68;
  paVar1 = &description.field_2;
  do {
    iVar8 = 1;
    do {
      local_f0 = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"conditional_return_","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        description.field_2._M_allocated_capacity = *psVar5;
        description.field_2._8_8_ = plVar4[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar5;
        description._M_dataplus._M_p = (pointer)*plVar4;
      }
      description._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&description);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        name.field_2._M_allocated_capacity = *psVar5;
        name.field_2._8_8_ = plVar4[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar5;
        name._M_dataplus._M_p = (pointer)*plVar4;
      }
      name._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (RVar10 < RETURNMODE_LAST) {
        pcVar7 = (&PTR_anon_var_dwarf_3147a0_0078be78)[RVar10];
      }
      else {
        pcVar7 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,pcVar7,(allocator<char> *)&local_88);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        description.field_2._M_allocated_capacity = *psVar5;
        description.field_2._8_8_ = plVar4[3];
        description._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        description.field_2._M_allocated_capacity = *psVar5;
        description._M_dataplus._M_p = (pointer)*plVar4;
      }
      description._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      pSVar3 = makeConditionalReturnInFuncCase
                         ((Context *)pTVar2[1]._vptr_TestNode,name._M_dataplus._M_p,
                          description._M_dataplus._M_p,RVar10,iVar8 == 1);
      tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != paVar1) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      iVar8 = iVar8 + -1;
    } while (iVar8 == 0);
    RVar10 = RVar10 + RETURNMODE_NEVER;
  } while (RVar10 != RETURNMODE_LAST);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  pTVar2 = local_68;
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)local_68[1]._vptr_TestNode,"double_return_vertex",
             "Unconditional double return in function",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvec4 getColor (void)\n{\n    return vec4(a_coords.xyz, 1.0);\n    return vec4(a_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,"double_return_fragment",
             "Unconditional double return in function",false,
             "varying mediump vec4 v_coords;\nmediump vec4 getColor (void)\n{\n    return vec4(v_coords.xyz, 1.0);\n    return vec4(v_coords.wzy, 1.0);\n}\n\nvoid main (void)\n{\n    gl_FragColor = getColor();\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,"last_statement_in_main_vertex",
             "Return as a final statement in main()",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(a_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,"last_statement_in_main_fragment",
             "Return as a final statement in main()",false,
             "varying mediump vec4 v_coords;\n\nvoid main (void)\n{\n    gl_FragColor = vec4(v_coords.xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  iVar8 = 0;
  do {
    local_60 = "";
    if (iVar8 != 0) {
      local_60 = "in_func_";
    }
    local_38 = " in main()";
    if (iVar8 != 0) {
      local_38 = " in user-defined function";
    }
    RVar10 = RETURNMODE_ALWAYS;
    do {
      iVar9 = 1;
      do {
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"output_write_","");
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          description.field_2._M_allocated_capacity = *psVar5;
          description.field_2._8_8_ = plVar4[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar5;
          description._M_dataplus._M_p = (pointer)*plVar4;
        }
        description._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&description);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          name.field_2._M_allocated_capacity = *psVar5;
          name.field_2._8_8_ = plVar4[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar5;
          name._M_dataplus._M_p = (pointer)*plVar4;
        }
        name._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (RVar10 < RETURNMODE_LAST) {
          pcVar7 = (&PTR_anon_var_dwarf_3147a0_0078be78)[RVar10];
        }
        else {
          pcVar7 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,pcVar7,(allocator<char> *)local_58);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          description.field_2._M_allocated_capacity = *psVar5;
          description.field_2._8_8_ = plVar4[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar5;
          description._M_dataplus._M_p = (pointer)*plVar4;
        }
        description._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        pTVar2 = local_68;
        pSVar3 = makeOutputWriteReturnCase
                           ((Context *)local_68[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,iVar8 != 0,RVar10,iVar9 == 1);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 == 0);
      RVar10 = RVar10 + RETURNMODE_NEVER;
    } while (RVar10 != RETURNMODE_LAST);
    bVar11 = iVar8 == 0;
    iVar8 = iVar8 + 1;
  } while (bVar11);
  iVar8 = 0;
  do {
    local_60 = "static";
    if (iVar8 != 0) {
      local_60 = "dynamic";
    }
    RVar10 = RETURNMODE_ALWAYS;
    do {
      iVar9 = 1;
      do {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"return_in_","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
        local_88 = &local_78;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_78 = *plVar6;
          lStack_70 = plVar4[3];
        }
        else {
          local_78 = *plVar6;
          local_88 = (long *)*plVar4;
        }
        local_80 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_f0 = &local_e0;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar4[3];
        }
        else {
          local_e0 = *plVar6;
          local_f0 = (long *)*plVar4;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          description.field_2._M_allocated_capacity = *psVar5;
          description.field_2._8_8_ = plVar4[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar5;
          description._M_dataplus._M_p = (pointer)*plVar4;
        }
        description._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&description);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          name.field_2._M_allocated_capacity = *psVar5;
          name.field_2._8_8_ = plVar4[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar5;
          name._M_dataplus._M_p = (pointer)*plVar4;
        }
        name._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        if (RVar10 < RETURNMODE_LAST) {
          pcVar7 = (&PTR_anon_var_dwarf_3147a0_0078be78)[RVar10];
        }
        else {
          pcVar7 = (char *)0x0;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,pcVar7,(allocator<char> *)&local_88);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar5) {
          description.field_2._M_allocated_capacity = *psVar5;
          description.field_2._8_8_ = plVar4[3];
          description._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          description.field_2._M_allocated_capacity = *psVar5;
          description._M_dataplus._M_p = (pointer)*plVar4;
        }
        description._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        pTVar2 = local_68;
        pSVar3 = makeReturnInLoopCase
                           ((Context *)local_68[1]._vptr_TestNode,name._M_dataplus._M_p,
                            description._M_dataplus._M_p,iVar8 != 0,RVar10,iVar9 == 1);
        tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)description._M_dataplus._M_p != paVar1) {
          operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        iVar9 = iVar9 + -1;
      } while (iVar9 == 0);
      RVar10 = RVar10 + RETURNMODE_NEVER;
    } while (RVar10 != RETURNMODE_LAST);
    bVar11 = iVar8 == 0;
    iVar8 = iVar8 + 1;
  } while (bVar11);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  pTVar2 = local_68;
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)local_68[1]._vptr_TestNode,"return_in_infinite_loop_vertex",
             "Return in infinite loop",true,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_coords;\nvarying highp vec4 v_color;\nuniform int ui_zero;\n\nhighp vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn a_coords;\n\treturn a_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_Position = a_position;\n    v_color = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  pSVar3 = (ShaderReturnCase *)operator_new(0x130);
  ShaderReturnCase::ShaderReturnCase
            (pSVar3,(Context *)pTVar2[1]._vptr_TestNode,"return_in_infinite_loop_fragment",
             "Return in infinite loop",false,
             "varying mediump vec4 v_coords;\nuniform int ui_zero;\n\nmediump vec4 getCoords (void)\n{\n\tfor (int i = 1; i < 10; i += ui_zero)\n\t\treturn v_coords;\n\treturn v_coords.wzyx;\n}\n\nvoid main (void)\n{\n    gl_FragColor = vec4(getCoords().xyz, 1.0);\n    return;\n}\n"
             ,evalReturnAlways,1);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
  return extraout_EAX;
}

Assistant:

void ShaderReturnTests::init (void)
{
	// Single return statement in function.
	addChild(new ShaderReturnCase(m_context, "single_return_vertex", "Single return statement in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "single_return_fragment", "Single return statement in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Conditional return statement in function.
	for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
	{
		for (int isFragment = 0; isFragment < 2; isFragment++)
		{
			string name			= string("conditional_return_") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
			string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in function";
			addChild(makeConditionalReturnInFuncCase(m_context, name.c_str(), description.c_str(), (ReturnMode)returnMode, isFragment == 0));
		}
	}

	// Unconditional double return in function.
	addChild(new ShaderReturnCase(m_context, "double_return_vertex", "Unconditional double return in function", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"vec4 getColor (void)\n"
		"{\n"
		"    return vec4(a_coords.xyz, 1.0);\n"
		"    return vec4(a_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = getColor();\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "double_return_fragment", "Unconditional double return in function", false,
		"varying mediump vec4 v_coords;\n"
		"mediump vec4 getColor (void)\n"
		"{\n"
		"    return vec4(v_coords.xyz, 1.0);\n"
		"    return vec4(v_coords.wzy, 1.0);\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = getColor();\n"
		"}\n", evalReturnAlways));

	// Last statement in main.
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_vertex", "Return as a final statement in main()", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(a_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));
	addChild(new ShaderReturnCase(m_context, "last_statement_in_main_fragment", "Return as a final statement in main()", false,
		"varying mediump vec4 v_coords;\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(v_coords.xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways));

	// Return between output variable writes.
	for (int inFunc = 0; inFunc < 2; inFunc++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name = string("output_write_") + (inFunc ? "in_func_" : "") + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string desc = string(getReturnModeDesc((ReturnMode)returnMode)) + (inFunc ? " in user-defined function" : " in main()") + " between output writes";

				addChild(makeOutputWriteReturnCase(m_context, name.c_str(), desc.c_str(), inFunc != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Conditional return statement in loop.
	for (int isDynamicLoop = 0; isDynamicLoop < 2; isDynamicLoop++)
	{
		for (int returnMode = 0; returnMode < RETURNMODE_LAST; returnMode++)
		{
			for (int isFragment = 0; isFragment < 2; isFragment++)
			{
				string name			= string("return_in_") + (isDynamicLoop ? "dynamic" : "static") + "_loop_" + getReturnModeName((ReturnMode)returnMode) + (isFragment ? "_fragment" : "_vertex");
				string description	= string(getReturnModeDesc((ReturnMode)returnMode)) + " in loop";
				addChild(makeReturnInLoopCase(m_context, name.c_str(), description.c_str(), isDynamicLoop != 0, (ReturnMode)returnMode, isFragment == 0));
			}
		}
	}

	// Unconditional return in infinite loop.
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_vertex", "Return in infinite loop", true,
		"attribute highp vec4 a_position;\n"
		"attribute highp vec4 a_coords;\n"
		"varying highp vec4 v_color;\n"
		"uniform int ui_zero;\n\n"
		"highp vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return a_coords;\n"
		"	return a_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_Position = a_position;\n"
		"    v_color = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
	addChild(new ShaderReturnCase(m_context, "return_in_infinite_loop_fragment", "Return in infinite loop", false,
		"varying mediump vec4 v_coords;\n"
		"uniform int ui_zero;\n\n"
		"mediump vec4 getCoords (void)\n"
		"{\n"
		"	for (int i = 1; i < 10; i += ui_zero)\n"
		"		return v_coords;\n"
		"	return v_coords.wzyx;\n"
		"}\n\n"
		"void main (void)\n"
		"{\n"
		"    gl_FragColor = vec4(getCoords().xyz, 1.0);\n"
		"    return;\n"
		"}\n", evalReturnAlways, REQUIRE_DYNAMIC_LOOPS));
}